

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.h
# Opt level: O2

image * __thiscall basisu::image::operator=(image *this,image *rhs)

{
  uint32_t uVar1;
  
  if (this != rhs) {
    uVar1 = rhs->m_height;
    this->m_width = rhs->m_width;
    this->m_height = uVar1;
    this->m_pitch = rhs->m_pitch;
    vector<basisu::color_rgba>::operator=(&this->m_pixels,&rhs->m_pixels);
  }
  return this;
}

Assistant:

image &operator= (const image &rhs)
		{
			if (this != &rhs)
			{
				m_width = rhs.m_width;
				m_height = rhs.m_height;
				m_pitch = rhs.m_pitch;
				m_pixels = rhs.m_pixels;
			}
			return *this;
		}